

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::TextOutput::~TextOutput(TextOutput *this)

{
  TextOutput *in_stack_00000010;
  
  ~TextOutput(in_stack_00000010);
  return;
}

Assistant:

void TextOutput::comment(uint32 v, const char* fmt, ...) const {
	if (verbosity() >= v) {
		printf("%s", format[cat_comment]);
		va_list args;
		va_start(args, fmt);
		vfprintf(stdout, fmt, args);
		va_end(args);
		fflush(stdout);
	}
}